

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

void extent_dalloc_wrapper
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  extent_dalloc_t *peVar1;
  code *pcVar2;
  _Bool _Var3;
  char cVar4;
  extent_hooks_t *peVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 gdump_add;
  undefined1 in_R9B;
  ulong uVar6;
  void *addr;
  ulong uVar7;
  
  if ((*r_extent_hooks != &extent_hooks_default) || (!opt_retain)) {
    extent_deregister_impl(tsdn,extent,SUB81(r_extent_hooks,0));
    *(ushort *)&extent->e_addr = *(ushort *)&extent->e_addr & 0xf000;
    if (*r_extent_hooks == (extent_hooks_t *)0x0) {
      peVar5 = base_extent_hooks_get(arena->base);
      *r_extent_hooks = peVar5;
    }
    if (*r_extent_hooks == &extent_hooks_default) {
      addr = (void *)((ulong)extent->e_addr & 0xfffffffffffff000);
      uVar7 = (extent->field_2).e_size_esn;
      _Var3 = extent_in_dss(addr);
      gdump_add = extraout_DL;
      if (!_Var3) {
        _Var3 = extent_dalloc_mmap(addr,uVar7 & 0xfffffffffffff000);
        gdump_add = extraout_DL_00;
        goto LAB_0012eaea;
      }
    }
    else {
      extent_hook_pre_reentrancy(tsdn,arena);
      peVar1 = (*r_extent_hooks)->dalloc;
      if (peVar1 == (extent_dalloc_t *)0x0) {
        _Var3 = true;
      }
      else {
        _Var3 = (*peVar1)(*r_extent_hooks,(void *)((ulong)extent->e_addr & 0xfffffffffffff000),
                          (extent->field_2).e_size_esn & 0xfffffffffffff000,
                          (_Bool)((byte)((uint)extent->e_bits >> 0xd) & 1),arena->base->ind);
      }
      extent_hook_post_reentrancy(tsdn);
      gdump_add = extraout_DL_01;
LAB_0012eaea:
      if (_Var3 == false) {
        extent_dalloc(tsdn,arena,extent);
        return;
      }
    }
    extent_register_impl(tsdn,extent,(_Bool)gdump_add);
  }
  if (*r_extent_hooks != &extent_hooks_default) {
    extent_hook_pre_reentrancy(tsdn,arena);
  }
  uVar7 = 0x8000;
  if ((extent->e_bits & 0x2000) != 0) {
    uVar6 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
    _Var3 = extent_decommit_wrapper(tsdn,arena,r_extent_hooks,extent,0,uVar6);
    in_R9B = (undefined1)uVar6;
    if (_Var3) {
      pcVar2 = (code *)(*r_extent_hooks)->purge_forced;
      if (pcVar2 != (code *)0x0) {
        uVar6 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
        in_R9B = (undefined1)arena->base->ind;
        cVar4 = (*pcVar2)(*r_extent_hooks,(ulong)extent->e_addr & 0xfffffffffffff000,uVar6,0,uVar6);
        if (cVar4 == '\0') goto LAB_0012ebe0;
      }
      if ((extent->e_bits & 0x30000) != 0x20000) {
        pcVar2 = (code *)(*r_extent_hooks)->purge_lazy;
        if (pcVar2 != (code *)0x0) {
          uVar6 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
          in_R9B = (undefined1)arena->base->ind;
          uVar7 = 0;
          (*pcVar2)(*r_extent_hooks,(ulong)extent->e_addr & 0xfffffffffffff000,uVar6,0,uVar6);
          goto LAB_0012ebe0;
        }
      }
      uVar7 = 0;
    }
  }
LAB_0012ebe0:
  if (*r_extent_hooks != &extent_hooks_default) {
    extent_hook_post_reentrancy(tsdn);
  }
  extent->e_bits = extent->e_bits & 0xffffffffffff7fff | uVar7;
  extent_record(tsdn,arena,r_extent_hooks,&arena->extents_retained,extent,(_Bool)in_R9B);
  return;
}

Assistant:

void
extent_dalloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	assert(extent_dumpable_get(extent));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Avoid calling the default extent_dalloc unless have to. */
	if (*r_extent_hooks != &extent_hooks_default || extent_may_dalloc()) {
		/*
		 * Deregister first to avoid a race with other allocating
		 * threads, and reregister if deallocation fails.
		 */
		extent_deregister(tsdn, extent);
		if (!extent_dalloc_wrapper_try(tsdn, arena, r_extent_hooks,
		    extent)) {
			return;
		}
		extent_reregister(tsdn, extent);
	}

	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	/* Try to decommit; purge if that fails. */
	bool zeroed;
	if (!extent_committed_get(extent)) {
		zeroed = true;
	} else if (!extent_decommit_wrapper(tsdn, arena, r_extent_hooks, extent,
	    0, extent_size_get(extent))) {
		zeroed = true;
	} else if ((*r_extent_hooks)->purge_forced != NULL &&
	    !(*r_extent_hooks)->purge_forced(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena))) {
		zeroed = true;
	} else if (extent_state_get(extent) == extent_state_muzzy ||
	    ((*r_extent_hooks)->purge_lazy != NULL &&
	    !(*r_extent_hooks)->purge_lazy(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena)))) {
		zeroed = false;
	} else {
		zeroed = false;
	}
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_zeroed_set(extent, zeroed);

	if (config_prof) {
		extent_gdump_sub(tsdn, extent);
	}

	extent_record(tsdn, arena, r_extent_hooks, &arena->extents_retained,
	    extent, false);
}